

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

void __thiscall cmCTestLaunch::WriteXML(cmCTestLaunch *this)

{
  pointer pcVar1;
  cmXMLElement e2;
  string logXML;
  cmXMLWriter xml;
  cmGeneratedFileStream fxml;
  cmXMLElement local_2e8;
  string local_2e0;
  char *local_2c0;
  cmXMLWriter local_2b8;
  cmGeneratedFileStream local_260;
  
  pcVar1 = (this->LogDir)._M_dataplus._M_p;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0,pcVar1,pcVar1 + (this->LogDir)._M_string_length);
  std::__cxx11::string::append((char *)&local_2e0);
  std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)(this->LogHash)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_2e0);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_260,&local_2e0,false,None);
  cmXMLWriter::cmXMLWriter(&local_2b8,(ostream *)&local_260,2);
  cmXMLElement::cmXMLElement(&local_2e8,&local_2b8,"Failure");
  local_2c0 = "Error";
  if (this->ExitCode == 0) {
    local_2c0 = "Warning";
  }
  cmXMLWriter::Attribute<char_const*>(local_2e8.xmlwr,"type",&local_2c0);
  WriteXMLAction(this,&local_2e8);
  WriteXMLCommand(this,&local_2e8);
  WriteXMLResult(this,&local_2e8);
  WriteXMLLabels(this,&local_2e8);
  cmXMLWriter::EndElement(local_2e8.xmlwr);
  cmXMLWriter::~cmXMLWriter(&local_2b8);
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmCTestLaunch::WriteXML()
{
  // Name the xml file.
  std::string logXML = this->LogDir;
  logXML += this->IsError() ? "error-" : "warning-";
  logXML += this->LogHash;
  logXML += ".xml";

  // Use cmGeneratedFileStream to atomically create the report file.
  cmGeneratedFileStream fxml(logXML);
  cmXMLWriter xml(fxml, 2);
  cmXMLElement e2(xml, "Failure");
  e2.Attribute("type", this->IsError() ? "Error" : "Warning");
  this->WriteXMLAction(e2);
  this->WriteXMLCommand(e2);
  this->WriteXMLResult(e2);
  this->WriteXMLLabels(e2);
}